

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O3

void __thiscall xe::ri::Number::~Number(Number *this)

{
  ~Number(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

~Number			(void) {}